

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O2

ulong __thiscall nuraft::raft_server::get_expected_committed_log_idx(raft_server *this)

{
  char cVar1;
  _Hash_node_base *p_Var2;
  element_type *peVar3;
  pointer puVar4;
  uint64_t uVar5;
  bool bVar6;
  uint uVar7;
  int32 iVar8;
  int iVar9;
  mapped_type *pmVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  pointer puVar14;
  __node_base *p_Var15;
  size_t prev_quorum_idx;
  long lVar16;
  string tmp_str;
  vector<unsigned_long,_std::allocator<unsigned_long>_> matched_indexes;
  uint64_t leader_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  adjust_commit_index_params aci_params;
  string local_50;
  
  matched_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  matched_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  matched_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aci_params.peer_index_map_._M_h._M_buckets = &aci_params.peer_index_map_._M_h._M_single_bucket;
  aci_params.current_commit_index_ = 0;
  aci_params.expected_commit_index_ = 0;
  aci_params.peer_index_map_._M_h._M_bucket_count = 1;
  aci_params.peer_index_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  aci_params.peer_index_map_._M_h._M_element_count = 0;
  aci_params.peer_index_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  aci_params.peer_index_map_._M_h._M_rehash_policy._M_next_resize = 0;
  aci_params.peer_index_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&matched_indexes,0x10);
  std::__detail::
  _Rehash_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
             *)&aci_params.peer_index_map_,0x10);
  leader_index = get_current_leader_index(this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&matched_indexes,&leader_index);
  uVar5 = leader_index;
  pmVar10 = std::__detail::
            _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&aci_params.peer_index_map_,&this->id_);
  *pmVar10 = uVar5;
  p_Var15 = &(this->peers_)._M_h._M_before_begin;
  while (p_Var15 = p_Var15->_M_nxt, p_Var15 != (__node_base *)0x0) {
    p_Var2 = (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var15 + 2))->_M_max_load_factor)
             [0x10]._M_nxt;
    tmp_str._M_dataplus._M_p._0_4_ =
         *(undefined4 *)
          &(*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var15 + 2))->_M_max_load_factor)->
           _M_nxt->_M_nxt;
    pmVar10 = std::__detail::
              _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&aci_params.peer_index_map_,(key_type *)&tmp_str);
    *pmVar10 = (mapped_type)p_Var2;
    bVar6 = is_regular_member(this,(ptr<peer> *)(p_Var15 + 2));
    if (bVar6) {
      tmp_str._M_dataplus._M_p =
           (pointer)((__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)
                    &((_Prime_rehash_policy *)(p_Var15 + 2))->_M_max_load_factor)->_M_ptr->
                    matched_idx_;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&matched_indexes,(unsigned_long *)&tmp_str);
    }
  }
  uVar7 = get_num_voting_members(this);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<unsigned_long>>>
            (matched_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start,
             matched_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  iVar8 = get_quorum_for_commit(this);
  nuraft::context::get_params((context *)&tmp_str);
  lVar16 = (long)iVar8;
  cVar1 = tmp_str._M_dataplus._M_p[0x65];
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tmp_str._M_string_length);
  lVar13 = lVar16;
  if (cVar1 == '\x01') {
    sVar11 = get_not_responding_peers(this);
    if (sVar11 < (ulong)((int)uVar7 - lVar16)) {
      lVar13 = ~sVar11 + (long)(int)uVar7;
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3 != (element_type *)0x0) &&
         (iVar9 = (**(code **)(*(long *)peVar3 + 0x38))(), 5 < iVar9)) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&tmp_str,
                   "full consensus mode: %zu peers are not responding out of %d, adjust quorum %zu -> %zu"
                   ,sVar11,(ulong)uVar7,lVar16,lVar13);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"get_expected_committed_log_idx",0x4a5,&tmp_str);
        std::__cxx11::string::~string((string *)&tmp_str);
      }
    }
    else {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar3 != (element_type *)0x0) &&
         (iVar9 = (**(code **)(*(long *)peVar3 + 0x38))(), 5 < iVar9)) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&tmp_str,
                   "full consensus mode, but %zu peers are not responding, required quorum size %zu/%d"
                   ,sVar11,lVar16 + 1,(ulong)uVar7);
        (**(code **)(*(long *)peVar3 + 0x40))
                  (peVar3,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                   ,"get_expected_committed_log_idx",0x4a9,&tmp_str);
        std::__cxx11::string::~string((string *)&tmp_str);
      }
    }
  }
  peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar3 != (element_type *)0x0) &&
     (iVar9 = (**(code **)(*(long *)peVar3 + 0x38))(),
     puVar4 = matched_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish, 5 < iVar9)) {
    tmp_str._M_dataplus._M_p = (pointer)&tmp_str.field_2;
    tmp_str._M_string_length = 0;
    tmp_str.field_2._M_local_buf[0] = '\0';
    for (puVar14 = matched_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar4;
        puVar14 = puVar14 + 1) {
      std::__cxx11::to_string(&local_50,*puVar14);
      std::operator+(&local_b8,&local_50," ");
      std::__cxx11::string::append((string *)&tmp_str);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_50);
    }
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar3 != (element_type *)0x0) &&
       (iVar9 = (**(code **)(*(long *)peVar3 + 0x38))(), 5 < iVar9)) {
      peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_(&local_b8,"quorum idx %zu, %s",lVar13,tmp_str._M_dataplus._M_p);
      (**(code **)(*(long *)peVar3 + 0x40))
                (peVar3,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
                 ,"get_expected_committed_log_idx",0x4b2,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    std::__cxx11::string::~string((string *)&tmp_str);
  }
  aci_params.current_commit_index_ =
       (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
  aci_params.expected_commit_index_ =
       matched_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start[lVar13];
  uVar12 = (**(code **)(*(long *)(this->state_machine_).
                                 super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 0xa8))();
  if (((aci_params.expected_commit_index_ != uVar12) &&
      (peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      peVar3 != (element_type *)0x0)) &&
     (iVar9 = (**(code **)(*(long *)peVar3 + 0x38))(), 5 < iVar9)) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&tmp_str,"commit index adjusted: %lu -> %lu",aci_params.expected_commit_index_,uVar12
              );
    (**(code **)(*(long *)peVar3 + 0x40))
              (peVar3,6,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_append_entries.cxx"
               ,"get_expected_committed_log_idx",0x4ba,&tmp_str);
    std::__cxx11::string::~string((string *)&tmp_str);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&aci_params.peer_index_map_._M_h);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&matched_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return uVar12;
}

Assistant:

ulong raft_server::get_expected_committed_log_idx() {
    std::vector<ulong> matched_indexes;
    state_machine::adjust_commit_index_params aci_params;
    matched_indexes.reserve(16);
    aci_params.peer_index_map_.reserve(16);

    // Put the index of leader itself.
    uint64_t leader_index = get_current_leader_index();
    matched_indexes.push_back( leader_index );
    aci_params.peer_index_map_[id_] = leader_index;

    for (auto& entry: peers_) {
        ptr<peer>& p = entry.second;
        aci_params.peer_index_map_[p->get_id()] = p->get_matched_idx();

        if (!is_regular_member(p)) continue;
        matched_indexes.push_back( p->get_matched_idx() );
    }
    int voting_members = get_num_voting_members();
    assert((int32)matched_indexes.size() == voting_members);

    // NOTE: Descending order.
    //       e.g.) 100 100 99 95 92
    //             => commit on 99 if `quorum_idx == 2`.
    std::sort( matched_indexes.begin(),
               matched_indexes.end(),
               std::greater<ulong>() );

    size_t quorum_idx = get_quorum_for_commit();
    if (ctx_->get_params()->use_full_consensus_among_healthy_members_) {
        size_t not_responding_peers = get_not_responding_peers();
        if (not_responding_peers < voting_members - quorum_idx) {
            // If full consensus option is on, commit should be
            // agreed by all healthy members, and the number of
            // aggreed members should be bigger than regular quorum size.
            size_t prev_quorum_idx = quorum_idx;
            quorum_idx = voting_members - not_responding_peers - 1;
            p_tr( "full consensus mode: %zu peers are not responding out of %d, "
                  "adjust quorum %zu -> %zu",
                  not_responding_peers, voting_members,
                  prev_quorum_idx, quorum_idx );
        } else {
            p_tr( "full consensus mode, but %zu peers are not responding, "
                  "required quorum size %zu/%d",
                  not_responding_peers, quorum_idx + 1, voting_members );
        }
    }

    if (l_ && l_->get_level() >= 6) {
        std::string tmp_str;
        for (ulong m_idx: matched_indexes) {
            tmp_str += std::to_string(m_idx) + " ";
        }
        p_tr("quorum idx %zu, %s", quorum_idx, tmp_str.c_str());
    }

    aci_params.current_commit_index_ = quick_commit_index_;
    aci_params.expected_commit_index_ = matched_indexes[quorum_idx];
    uint64_t adjusted_commit_index = state_machine_->adjust_commit_index(aci_params);
    if (aci_params.expected_commit_index_ != adjusted_commit_index) {
        p_tr( "commit index adjusted: %" PRIu64 " -> %" PRIu64,
              aci_params.expected_commit_index_, adjusted_commit_index );
    }
    return adjusted_commit_index;
}